

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_specific.cc
# Opt level: O3

ThreadAffinity * highwayhash::GetThreadAffinity(void)

{
  int iVar1;
  cpu_set_t *__cpuset;
  
  __cpuset = (cpu_set_t *)malloc(0x80);
  iVar1 = sched_getaffinity(0,0x80,__cpuset);
  if (iVar1 == 0) {
    return (ThreadAffinity *)__cpuset;
  }
  printf("os_specific CHECK failed at line %d\n",0x88);
  abort();
}

Assistant:

ThreadAffinity* GetThreadAffinity() {
  ThreadAffinity* affinity =
      static_cast<ThreadAffinity*>(malloc(sizeof(ThreadAffinity)));
#if OS_WIN
  DWORD_PTR system_affinity;
  const BOOL ok = GetProcessAffinityMask(GetCurrentProcess(), &affinity->mask,
                                         &system_affinity);
  CHECK(ok);
#elif OS_LINUX
  const pid_t pid = 0;  // current thread
  const int err = sched_getaffinity(pid, sizeof(cpu_set_t), &affinity->set);
  CHECK(err == 0);
#elif OS_FREEBSD
  const pid_t pid = getpid();  // current thread
  const int err = cpuset_getaffinity(CPU_LEVEL_WHICH, CPU_WHICH_PID, pid,
                                     sizeof(cpuset_t), &affinity->set);
  CHECK(err == 0);
#elif OS_MAC
  const int err = mac_getaffinity(&affinity->set);
  CHECK(err == 0);
#endif
  return affinity;
}